

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability.h
# Opt level: O1

void shared_container_free(shared_container_t *container)

{
  croaring_refcount_t *pcVar1;
  
  LOCK();
  pcVar1 = &container->counter;
  *pcVar1 = *pcVar1 - 1;
  UNLOCK();
  if (*pcVar1 == 0) {
    container_free(container->container,container->typecode);
    container->container = (container_t *)0x0;
    roaring_free(container);
    return;
  }
  return;
}

Assistant:

static inline bool croaring_refcount_dec(croaring_refcount_t *val) {
    // It is important to enforce any possible access to the object in one
    // thread (through an existing reference) to happen before deleting the
    // object in a different thread. This is achieved by a "release" operation
    // after dropping a reference (any access to the object through this
    // reference must obviously happened before), and an "acquire" operation
    // before deleting the object.
    bool is_zero = atomic_fetch_sub_explicit(val, 1, memory_order_release) == 1;
    if (is_zero) {
        atomic_thread_fence(memory_order_acquire);
    }
    return is_zero;
}